

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar7;
  long lVar8;
  LinkClosure *pLVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  byte local_592;
  bool local_535;
  byte local_534;
  byte local_533;
  bool local_51b;
  byte local_51a;
  char *dirs;
  undefined1 local_4d8 [8];
  string dirVar;
  undefined1 local_498 [8];
  string useVar;
  string *li;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  LinkClosure *lc;
  string local_430 [8];
  string suffix_1;
  undefined1 local_3f0 [8];
  string d_1;
  string *topSourceDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_368;
  string local_348 [8];
  string suffix;
  undefined1 local_308 [8];
  string d;
  string *ri;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string *topBinaryDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rdirs;
  string local_2b0;
  string *local_290;
  string *installPrefix;
  string local_280;
  char *local_260;
  char *stagePath;
  string local_250;
  allocator<char> local_229;
  string local_228;
  char *local_208;
  char *sysrootLink;
  string rootPath;
  string local_1d8;
  char *local_1b8;
  char *build_rpath;
  string local_1a8;
  char *local_188;
  char *install_rpath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_148;
  byte local_121;
  undefined1 local_120 [7];
  bool use_relative_build_rpath;
  string targetOutputDir;
  string local_f8;
  string *local_d8;
  string *originToken;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  byte local_7e;
  byte local_7d;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  undefined1 local_78 [2];
  bool use_link_rpath;
  bool use_build_rpath;
  bool use_install_rpath;
  byte local_55;
  bool linking_for_install;
  allocator<char> local_41;
  string local_40;
  byte local_1a;
  byte local_19;
  bool outputRuntime;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool for_install_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *runtimeDirs_local;
  cmComputeLinkInformation *this_local;
  
  pcVar1 = this->Makefile;
  local_19 = for_install;
  pvStack_18 = runtimeDirs;
  runtimeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
  bVar3 = cmMakefile::IsOn(pcVar1,&local_40);
  local_51a = 0;
  if (!bVar3) {
    local_51a = std::__cxx11::string::empty();
    local_51a = local_51a ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1a = local_51a & 1;
  local_7a = 0;
  local_7b = 0;
  local_51b = true;
  if ((local_19 & 1) == 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,"BUILD_WITH_INSTALL_RPATH",&local_79);
    local_7b = 1;
    local_51b = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_78);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  local_55 = local_51b;
  local_533 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    local_533 = 0;
    if (bVar3) {
      local_533 = local_55;
    }
  }
  local_7c = local_533 & 1;
  local_534 = 0;
  if ((local_1a & 1) != 0) {
    bVar3 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    local_534 = 0;
    if (bVar3) {
      local_534 = local_55 ^ 0xff;
    }
  }
  local_7d = local_534 & 1;
  local_a2 = 0;
  local_a3 = 0;
  originToken._6_1_ = 0;
  originToken._5_1_ = 0;
  local_535 = false;
  if (((local_1a & 1) != 0) && (local_535 = false, (local_55 & 1) != 0)) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_SKIP_INSTALL_RPATH",&local_a1);
    local_a3 = 1;
    bVar3 = cmMakefile::IsOn(pcVar1,&local_a0);
    local_535 = false;
    if (!bVar3) {
      pcVar2 = this->Target;
      std::allocator<char>::allocator();
      originToken._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"INSTALL_RPATH_USE_LINK_PATH",
                 (allocator<char> *)((long)&originToken + 7));
      originToken._5_1_ = 1;
      local_535 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_c8);
    }
  }
  if ((originToken._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((originToken._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&originToken + 7));
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  local_7e = local_535;
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN",
             (allocator<char> *)(targetOutputDir.field_2._M_local_buf + 0xf));
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)(targetOutputDir.field_2._M_local_buf + 0xf));
  local_d8 = psVar5;
  cmGeneratorTarget::GetDirectory
            ((string *)local_120,this->Target,&this->Config,RuntimeBinaryArtifact);
  pcVar2 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"BUILD_RPATH_USE_ORIGIN",
             (allocator<char> *)
             ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_148);
  local_592 = 0;
  if (bVar3) {
    uVar4 = std::__cxx11::string::empty();
    local_592 = 0;
    if ((uVar4 & 1) == 0) {
      local_592 = std::__cxx11::string::empty();
      local_592 = local_592 ^ 0xff;
    }
  }
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_121 = local_592 & 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&install_rpath);
  if ((local_7c & 1) != 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"INSTALL_RPATH",(allocator<char> *)((long)&build_rpath + 7));
    pcVar6 = cmGeneratorTarget::GetProperty(pcVar2,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&build_rpath + 7));
    local_188 = pcVar6;
    cmCLI_ExpandListUnique
              (pcVar6,pvStack_18,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&install_rpath);
  }
  if ((local_7d & 1) != 0) {
    pcVar2 = this->Target;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"BUILD_RPATH",
               (allocator<char> *)(rootPath.field_2._M_local_buf + 0xf));
    pcVar6 = cmGeneratorTarget::GetProperty(pcVar2,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)(rootPath.field_2._M_local_buf + 0xf));
    local_1b8 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      cmCLI_ExpandListUnique
                (pcVar6,pvStack_18,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&install_rpath);
    }
  }
  if (((local_7d & 1) != 0) || ((local_7e & 1) != 0)) {
    std::__cxx11::string::string((string *)&sysrootLink);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"CMAKE_SYSROOT_LINK",&local_229);
    pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    local_208 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"CMAKE_SYSROOT",(allocator<char> *)((long)&stagePath + 7));
      psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_250);
      std::__cxx11::string::operator=((string *)&sysrootLink,(string *)psVar5);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stagePath + 7));
    }
    else {
      std::__cxx11::string::operator=((string *)&sysrootLink,pcVar6);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"CMAKE_STAGING_PREFIX",
               (allocator<char> *)((long)&installPrefix + 7));
    pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)((long)&installPrefix + 7));
    pcVar1 = this->Makefile;
    local_260 = pcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"CMAKE_INSTALL_PREFIX",(allocator<char> *)((long)&rdirs + 7));
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rdirs + 7));
    local_290 = psVar5;
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&sysrootLink);
    this_00 = GetRuntimeSearchPath_abi_cxx11_(this);
    psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    ri = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&ri), bVar3) {
      d.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      if ((local_7d & 1) == 0) {
        if ((local_7e & 1) != 0) {
          d_1.field_2._8_8_ = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
          bVar3 = cmsys::SystemTools::ComparePath
                            ((string *)d.field_2._8_8_,(string *)d_1.field_2._8_8_);
          if ((((!bVar3) &&
               (bVar3 = cmsys::SystemTools::ComparePath((string *)d.field_2._8_8_,psVar5), !bVar3))
              && (bVar3 = cmsys::SystemTools::IsSubDirectory
                                    ((string *)d.field_2._8_8_,(string *)d_1.field_2._8_8_), !bVar3)
              ) && (bVar3 = cmsys::SystemTools::IsSubDirectory((string *)d.field_2._8_8_,psVar5),
                   !bVar3)) {
            std::__cxx11::string::string((string *)local_3f0,(string *)d.field_2._8_8_);
            uVar7 = std::__cxx11::string::empty();
            if (((uVar7 & 1) == 0) &&
               (lVar8 = std::__cxx11::string::find((string *)local_3f0,(ulong)&sysrootLink),
               lVar8 == 0)) {
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)((long)&suffix_1.field_2 + 8),(ulong)local_3f0);
              std::__cxx11::string::operator=
                        ((string *)local_3f0,(string *)(suffix_1.field_2._M_local_buf + 8));
              std::__cxx11::string::~string((string *)(suffix_1.field_2._M_local_buf + 8));
            }
            else if ((local_260 != (char *)0x0) &&
                    ((*local_260 != '\0' &&
                     (lVar8 = std::__cxx11::string::find(local_3f0,(ulong)local_260), lVar8 == 0))))
            {
              strlen(local_260);
              std::__cxx11::string::substr((ulong)local_430,(ulong)local_3f0);
              std::__cxx11::string::operator=((string *)local_3f0,(string *)local_290);
              std::__cxx11::string::operator+=((string *)local_3f0,"/");
              std::__cxx11::string::operator+=((string *)local_3f0,local_430);
              cmsys::SystemTools::ConvertToUnixSlashes((string *)local_3f0);
              std::__cxx11::string::~string(local_430);
            }
            pVar10 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&install_rpath,(value_type *)local_3f0);
            if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(pvStack_18,(value_type *)local_3f0);
            }
            std::__cxx11::string::~string((string *)local_3f0);
          }
        }
      }
      else {
        std::__cxx11::string::string((string *)local_308,(string *)d.field_2._8_8_);
        uVar7 = std::__cxx11::string::empty();
        if (((uVar7 & 1) == 0) &&
           (lVar8 = std::__cxx11::string::find((string *)local_308,(ulong)&sysrootLink), lVar8 == 0)
           ) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)((long)&suffix.field_2 + 8),(ulong)local_308);
          std::__cxx11::string::operator=
                    ((string *)local_308,(string *)(suffix.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
        }
        else if ((local_260 == (char *)0x0) ||
                ((*local_260 == '\0' ||
                 (lVar8 = std::__cxx11::string::find(local_308,(ulong)local_260), lVar8 != 0)))) {
          if (((local_121 & 1) != 0) &&
             ((bVar3 = cmsys::SystemTools::ComparePath((string *)local_308,psVar5), bVar3 ||
              (bVar3 = cmsys::SystemTools::IsSubDirectory((string *)local_308,psVar5), bVar3)))) {
            cmSystemTools::RelativePath(&local_368,(string *)local_120,(string *)local_308);
            std::__cxx11::string::operator=((string *)local_308,(string *)&local_368);
            std::__cxx11::string::~string((string *)&local_368);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              std::operator+(&local_3a8,local_d8,"/");
              std::operator+(&local_388,&local_3a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_308);
              std::__cxx11::string::operator=((string *)local_308,(string *)&local_388);
              std::__cxx11::string::~string((string *)&local_388);
              std::__cxx11::string::~string((string *)&local_3a8);
            }
            else {
              std::__cxx11::string::operator=((string *)local_308,(string *)local_d8);
            }
          }
        }
        else {
          strlen(local_260);
          std::__cxx11::string::substr((ulong)local_348,(ulong)local_308);
          std::__cxx11::string::operator=((string *)local_308,(string *)local_290);
          std::__cxx11::string::operator+=((string *)local_308,"/");
          std::__cxx11::string::operator+=((string *)local_308,local_348);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_308);
          std::__cxx11::string::~string(local_348);
        }
        pVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&install_rpath,(value_type *)local_308);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(pvStack_18,(value_type *)local_308);
        }
        std::__cxx11::string::~string((string *)local_308);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::__cxx11::string::~string((string *)&sysrootLink);
  }
  pLVar9 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pLVar9->Languages);
  li = (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&pLVar9->Languages);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&li), bVar3) {
    useVar.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"CMAKE_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   useVar.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dirVar.field_2 + 8),"_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH");
    std::__cxx11::string::~string((string *)(dirVar.field_2._M_local_buf + 8));
    bVar3 = cmMakefile::IsOn(this->Makefile,(string *)local_498);
    if (bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              useVar.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
                     "_IMPLICIT_LINK_DIRECTORIES");
      std::__cxx11::string::~string((string *)&dirs);
      pcVar6 = cmMakefile::GetDefinition(this->Makefile,(string *)local_4d8);
      if (pcVar6 != (char *)0x0) {
        cmCLI_ExpandListUnique
                  (pcVar6,pvStack_18,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&install_rpath);
      }
      std::__cxx11::string::~string((string *)local_4d8);
    }
    std::__cxx11::string::~string((string *)local_498);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCLI_ExpandListUnique
            (pcVar6,pvStack_18,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&install_rpath);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&install_rpath);
  std::__cxx11::string::~string((string *)local_120);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    if (const char* build_rpath = this->Target->GetProperty("BUILD_RPATH")) {
      // This will not resolve entries to use $ORIGIN, the user is expected to
      // do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = originToken + "/" + d;
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}